

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree_conflict *tree)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  uint *puVar5;
  void *__ptr;
  int *__s;
  ulong uVar6;
  uchar *puVar7;
  unsigned_short *puVar8;
  uchar uVar9;
  byte bVar10;
  uint i;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint result;
  ulong uVar15;
  uint reverse2;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  size_t sVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  
  uVar6 = (ulong)tree->numcodes;
  puVar5 = (uint *)malloc(uVar6 * 4);
  tree->codes = puVar5;
  uVar14 = tree->maxbitlen;
  uVar17 = uVar14 + 1;
  sVar18 = (ulong)uVar17 * 4;
  __ptr = malloc(sVar18);
  __s = (int *)malloc(sVar18);
  bVar20 = puVar5 == (uint *)0x0;
  bVar21 = __ptr == (void *)0x0;
  bVar22 = __s == (int *)0x0;
  uVar16 = 0x53;
  if (!bVar22 && (!bVar21 && !bVar20)) {
    uVar16 = 0;
  }
  if (bVar22 || (bVar21 || bVar20)) {
    free(__ptr);
  }
  else {
    if (uVar17 != 0) {
      sVar18 = (ulong)uVar17 << 2;
      memset(__s,0,sVar18);
      memset(__ptr,0,sVar18);
    }
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar12 = 0;
      do {
        piVar1 = (int *)((long)__ptr + (ulong)puVar4[uVar12] * 4);
        *piVar1 = *piVar1 + 1;
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    if (uVar14 != 0) {
      uVar6 = 2;
      if (2 < uVar17) {
        uVar6 = (ulong)uVar17;
      }
      iVar11 = *__s;
      lVar13 = 0;
      do {
        iVar11 = (iVar11 + *(int *)((long)__ptr + lVar13 * 4)) * 2;
        __s[lVar13 + 1] = iVar11;
        lVar13 = lVar13 + 1;
      } while (uVar6 - 1 != lVar13);
    }
    uVar6 = (ulong)tree->numcodes;
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar12 = 0;
      do {
        uVar15 = (ulong)puVar4[uVar12];
        if (uVar15 != 0) {
          uVar14 = __s[uVar15];
          __s[uVar15] = uVar14 + 1;
          puVar5[uVar12] = uVar14;
          puVar5[uVar12] = ~(-1 << ((byte)puVar4[uVar12] & 0x1f)) & uVar14;
        }
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    free(__ptr);
    free(__s);
    if (bVar22 || (bVar21 || bVar20)) {
      return uVar16;
    }
    __s = (int *)malloc(0x800);
    if (__s == (int *)0x0) {
      return 0x53;
    }
    memset(__s,0,0x800);
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar12 = 0;
      do {
        uVar14 = puVar4[uVar12];
        if (9 < uVar14) {
          uVar15 = 0;
          uVar16 = 8;
          iVar11 = 0;
          do {
            uVar15 = (ulong)((uint)uVar15 |
                            (uint)(((puVar5[uVar12] >> ((char)uVar14 - 9U & 0x1f)) >>
                                    (uVar16 & 0x1f) & 1) != 0) << ((byte)iVar11 & 0x1f));
            iVar11 = iVar11 + 1;
            uVar16 = uVar16 - 1;
          } while (iVar11 != 9);
          if (uVar14 < (uint)__s[uVar15]) {
            uVar14 = __s[uVar15];
          }
          __s[uVar15] = uVar14;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar6);
    }
    lVar13 = 0;
    sVar18 = 0x200;
    do {
      sVar19 = sVar18;
      uVar14 = 1 << ((char)__s[lVar13] - 9U & 0x1f);
      if ((uint)__s[lVar13] < 10) {
        uVar14 = 0;
      }
      uVar6 = (ulong)uVar14;
      sVar18 = sVar19 + uVar6;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x200);
    puVar7 = (uchar *)malloc(sVar18);
    tree->table_len = puVar7;
    puVar8 = (unsigned_short *)malloc(sVar18 * 2);
    tree->table_value = puVar8;
    uVar16 = 0x53;
    if (puVar8 != (unsigned_short *)0x0 && puVar7 != (uchar *)0x0) {
      if (sVar18 != 0) {
        lVar13 = 0;
        do {
          tree->table_len[lVar13] = '\x10';
          lVar13 = lVar13 + 1;
        } while (uVar6 + sVar19 != lVar13);
      }
      iVar11 = 0x200;
      lVar13 = 0;
      do {
        if (9 < (uint)__s[lVar13]) {
          uVar9 = (uchar)__s[lVar13];
          tree->table_len[lVar13] = uVar9;
          tree->table_value[lVar13] = (unsigned_short)iVar11;
          iVar11 = iVar11 + (1 << (uVar9 - 9 & 0x1f));
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x200);
      free(__s);
      if (tree->numcodes != 0) {
        uVar12 = 0;
        uVar15 = 0;
        do {
          uVar14 = tree->lengths[uVar12];
          if (uVar14 == 0) {
            bVar20 = false;
          }
          else {
            uVar17 = 0;
            bVar10 = 0;
            uVar16 = uVar14;
            do {
              uVar16 = uVar16 - 1;
              uVar17 = uVar17 | (uint)((tree->codes[uVar12] >> (uVar16 & 0x1f) & 1) != 0) <<
                                (bVar10 & 0x1f);
              bVar10 = bVar10 + 1;
            } while (uVar16 != 0);
            uVar15 = uVar15 + 1;
            bVar10 = (byte)uVar14;
            if (uVar14 < 10) {
              bVar20 = true;
              uVar14 = 1;
              do {
                uVar16 = uVar14 - 1 << (bVar10 & 0x1f) | uVar17;
                if (tree->table_len[uVar16] != '\x10') goto LAB_001cd766;
                tree->table_len[uVar16] = bVar10;
                tree->table_value[uVar16] = (unsigned_short)uVar12;
                uVar16 = uVar14 >> (9 - bVar10 & 0x1f);
                uVar14 = uVar14 + 1;
              } while (uVar16 == 0);
            }
            else {
              bVar2 = tree->table_len[uVar17 & 0x1ff];
              bVar20 = true;
              if (bVar2 < uVar14) goto LAB_001cd766;
              uVar3 = tree->table_value[uVar17 & 0x1ff];
              uVar14 = 1;
              do {
                uVar16 = (uVar14 - 1 << (bVar10 - 9 & 0x1f) | uVar17 >> 9) + (uint)uVar3;
                tree->table_len[uVar16] = bVar10;
                tree->table_value[uVar16] = (unsigned_short)uVar12;
                uVar16 = uVar14 >> (bVar2 - bVar10 & 0x1f);
                uVar14 = uVar14 + 1;
              } while (uVar16 == 0);
            }
            bVar20 = false;
          }
LAB_001cd766:
          if (bVar20) {
            return 0x37;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < tree->numcodes);
        if (1 < uVar15) {
          if (sVar18 == 0) {
            return 0;
          }
          lVar13 = 0;
          do {
            if (tree->table_len[lVar13] == '\x10') {
              return 0x37;
            }
            lVar13 = lVar13 + 1;
          } while (sVar19 + uVar6 != lVar13);
          return 0;
        }
      }
      if (sVar18 == 0) {
        return 0;
      }
      uVar12 = 0;
      do {
        if (tree->table_len[uVar12] == '\x10') {
          tree->table_len[uVar12] = (0x1ff < uVar12) * '\t' + '\x01';
          tree->table_value[uVar12] = 0xffff;
        }
        uVar12 = uVar12 + 1;
      } while (sVar19 + uVar6 != uVar12);
      return 0;
    }
  }
  free(__s);
  return uVar16;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree) {
  unsigned* blcount;
  unsigned* nextcode;
  unsigned error = 0;
  unsigned bits, n;

  tree->codes = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  blcount = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  nextcode = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  if(!tree->codes || !blcount || !nextcode) error = 83; /*alloc fail*/

  if(!error) {
    for(n = 0; n != tree->maxbitlen + 1; n++) blcount[n] = nextcode[n] = 0;
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits) {
      nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1u;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n) {
      if(tree->lengths[n] != 0) {
        tree->codes[n] = nextcode[tree->lengths[n]]++;
        /*remove superfluous bits from the code*/
        tree->codes[n] &= ((1u << tree->lengths[n]) - 1u);
      }
    }
  }

  lodepng_free(blcount);
  lodepng_free(nextcode);

  if(!error) error = HuffmanTree_makeTable(tree);
  return error;
}